

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

real __thiscall
fasttext::HierarchicalSoftmaxLoss::forward
          (HierarchicalSoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,
          int32_t targetIndex,State *state,real lr,bool backprop)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer piVar4;
  ulong uVar5;
  real rVar6;
  float fVar7;
  
  pvVar2 = (this->paths_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[targetIndex];
  piVar4 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) == piVar4) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    uVar5 = 0;
    pvVar3 = (this->codes_).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      rVar6 = BinaryLogisticLoss::binaryLogistic
                        (&this->super_BinaryLogisticLoss,piVar4[uVar5],state,
                         (*(ulong *)(*(long *)&pvVar3[iVar1].
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data +
                                    (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0,lr,
                         backprop);
      piVar4 = pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
      fVar7 = fVar7 + rVar6;
    } while (uVar5 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar2[iVar1].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar4 >> 2));
  }
  return fVar7;
}

Assistant:

real HierarchicalSoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  real loss = 0.0;
  int32_t target = targets[targetIndex];
  const std::vector<bool>& binaryCode = codes_[target];
  const std::vector<int32_t>& pathToRoot = paths_[target];
  for (int32_t i = 0; i < pathToRoot.size(); i++) {
    loss += binaryLogistic(pathToRoot[i], state, binaryCode[i], lr, backprop);
  }
  return loss;
}